

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_shuffle_2bytes(char *heap,LONGLONG length,int *status)

{
  undefined1 *__src;
  int *in_RDX;
  long in_RSI;
  undefined1 *in_RDI;
  char *heapptr;
  char *cptr;
  char *ptr;
  LONGLONG ii;
  undefined1 *local_38;
  undefined1 *local_30;
  long local_20;
  
  __src = (undefined1 *)malloc(in_RSI << 1);
  local_38 = in_RDI;
  local_30 = __src;
  for (local_20 = 0; local_20 < in_RSI; local_20 = local_20 + 1) {
    *local_30 = *local_38;
    local_30[in_RSI] = local_38[1];
    local_38 = local_38 + 2;
    local_30 = local_30 + 1;
  }
  memcpy(in_RDI,__src,in_RSI << 1);
  free(__src);
  return *in_RDX;
}

Assistant:

static int fits_shuffle_2bytes(char *heap, LONGLONG length, int *status)

/* shuffle the bytes in an array of 2-byte integers in the heap */

{
    LONGLONG ii;
    char *ptr, *cptr, *heapptr;
    
    ptr = malloc((size_t) (length * 2));
    heapptr = heap;
    cptr = ptr;
    
    for (ii = 0; ii < length; ii++) {
       *cptr = *heapptr;
       heapptr++;
       *(cptr + length) = *heapptr;
       heapptr++;
       cptr++;
    }
         
    memcpy(heap, ptr, (size_t) (length * 2));
    free(ptr);
    return(*status);
}